

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__normalize_downsample_coefficients
               (stbir__contributors *contributors,float *coefficients,stbir_filter filter,
               float scale_ratio,int input_size,int output_size)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  int width;
  int max;
  int range;
  float coefficient;
  float total;
  float scale;
  int skip;
  int j;
  int i;
  int num_coefficients;
  int num_contributors;
  int output_size_local;
  int input_size_local;
  float scale_ratio_local;
  stbir_filter filter_local;
  float *coefficients_local;
  stbir__contributors *contributors_local;
  
  iVar2 = stbir__get_contributors(scale_ratio,filter,input_size,output_size);
  iVar3 = stbir__get_coefficient_width(filter,scale_ratio);
  skip = 0;
  do {
    if (output_size <= skip) {
      for (scale = 0.0; (int)scale < iVar2; scale = (float)((int)scale + 1)) {
        total = 0.0;
        while( true ) {
          pfVar6 = stbir__get_coefficient(coefficients,filter,scale_ratio,(int)scale,(int)total);
          if ((*pfVar6 != 0.0) || (NAN(*pfVar6))) break;
          total = (float)((int)total + 1);
        }
        contributors[(int)scale].n0 = (int)total + contributors[(int)scale].n0;
        while (contributors[(int)scale].n0 < 0) {
          contributors[(int)scale].n0 = contributors[(int)scale].n0 + 1;
          total = (float)((int)total + 1);
        }
        iVar4 = stbir__min(iVar3,(contributors[(int)scale].n1 - contributors[(int)scale].n0) + 1);
        iVar5 = stbir__get_coefficient_width(filter,scale_ratio);
        for (skip = 0; (skip < iVar4 && (skip + (int)total < iVar5)); skip = skip + 1) {
          pfVar6 = stbir__get_coefficient
                             (coefficients,filter,scale_ratio,(int)scale,skip + (int)total);
          fVar1 = *pfVar6;
          pfVar6 = stbir__get_coefficient(coefficients,filter,scale_ratio,(int)scale,skip);
          *pfVar6 = fVar1;
        }
      }
      for (skip = 0; skip < iVar2; skip = skip + 1) {
        iVar3 = stbir__min(contributors[skip].n1,output_size + -1);
        contributors[skip].n1 = iVar3;
      }
      return;
    }
    range = 0;
    for (scale = 0.0; (int)scale < iVar2; scale = (float)((int)scale + 1)) {
      if ((skip < contributors[(int)scale].n0) || (contributors[(int)scale].n1 < skip)) {
        if (skip < contributors[(int)scale].n0) break;
      }
      else {
        pfVar6 = stbir__get_coefficient
                           (coefficients,filter,scale_ratio,(int)scale,
                            skip - contributors[(int)scale].n0);
        range = (int)(*pfVar6 + (float)range);
      }
    }
    if ((float)range <= 0.9) {
      __assert_fail("total > 0.9f",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x475,
                    "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                   );
    }
    if (1.1 <= (float)range) {
      __assert_fail("total < 1.1f",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x476,
                    "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                   );
    }
    for (scale = 0.0; (int)scale < iVar2; scale = (float)((int)scale + 1)) {
      if ((skip < contributors[(int)scale].n0) || (contributors[(int)scale].n1 < skip)) {
        if (skip < contributors[(int)scale].n0) break;
      }
      else {
        pfVar6 = stbir__get_coefficient
                           (coefficients,filter,scale_ratio,(int)scale,
                            skip - contributors[(int)scale].n0);
        *pfVar6 = (1.0 / (float)range) * *pfVar6;
      }
    }
    skip = skip + 1;
  } while( true );
}

Assistant:

static void stbir__normalize_downsample_coefficients(stbir__contributors* contributors, float* coefficients, stbir_filter filter, float scale_ratio, int input_size, int output_size)
{
    int num_contributors = stbir__get_contributors(scale_ratio, filter, input_size, output_size);
    int num_coefficients = stbir__get_coefficient_width(filter, scale_ratio);
    int i, j;
    int skip;

    for (i = 0; i < output_size; i++)
    {
        float scale;
        float total = 0;

        for (j = 0; j < num_contributors; j++)
        {
            if (i >= contributors[j].n0 && i <= contributors[j].n1)
            {
                float coefficient = *stbir__get_coefficient(coefficients, filter, scale_ratio, j, i - contributors[j].n0);
                total += coefficient;
            }
            else if (i < contributors[j].n0)
                break;
        }

        STBIR_ASSERT(total > 0.9f);
        STBIR_ASSERT(total < 1.1f);

        scale = 1 / total;

        for (j = 0; j < num_contributors; j++)
        {
            if (i >= contributors[j].n0 && i <= contributors[j].n1)
                *stbir__get_coefficient(coefficients, filter, scale_ratio, j, i - contributors[j].n0) *= scale;
            else if (i < contributors[j].n0)
                break;
        }
    }

    // Optimize: Skip zero coefficients and contributions outside of image bounds.
    // Do this after normalizing because normalization depends on the n0/n1 values.
    for (j = 0; j < num_contributors; j++)
    {
        int range, max, width;

        skip = 0;
        while (*stbir__get_coefficient(coefficients, filter, scale_ratio, j, skip) == 0)
            skip++;

        contributors[j].n0 += skip;

        while (contributors[j].n0 < 0)
        {
            contributors[j].n0++;
            skip++;
        }

        range = contributors[j].n1 - contributors[j].n0 + 1;
        max = stbir__min(num_coefficients, range);

        width = stbir__get_coefficient_width(filter, scale_ratio);
        for (i = 0; i < max; i++)
        {
            if (i + skip >= width)
                break;

            *stbir__get_coefficient(coefficients, filter, scale_ratio, j, i) = *stbir__get_coefficient(coefficients, filter, scale_ratio, j, i + skip);
        }

        continue;
    }

    // Using min to avoid writing into invalid pixels.
    for (i = 0; i < num_contributors; i++)
        contributors[i].n1 = stbir__min(contributors[i].n1, output_size - 1);
}